

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_vad.c
# Opt level: O0

int ps_vad_set_input_params(ps_vad_t *vad,int sample_rate,double frame_length)

{
  ulong uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double diff;
  double best_diff;
  int closest_sample_rate;
  int rv;
  int i;
  size_t frame_size;
  double frame_length_local;
  int sample_rate_local;
  ps_vad_t *vad_local;
  
  best_diff._4_4_ = 0;
  diff = 0.5;
  frame_length_local._4_4_ = sample_rate;
  if (sample_rate == 0) {
    frame_length_local._4_4_ = 16000;
  }
  frame_size = (size_t)frame_length;
  if ((frame_length == 0.0) && (!NAN(frame_length))) {
    frame_size = 0x3f9eb851eb851eb8;
  }
  for (closest_sample_rate = 0; closest_sample_rate < 4;
      closest_sample_rate = closest_sample_rate + 1) {
    dVar2 = ABS(1.0 - (double)sample_rates[closest_sample_rate] /
                      (double)(int)frame_length_local._4_4_);
    if (dVar2 < diff) {
      best_diff._4_4_ = sample_rates[closest_sample_rate];
      diff = dVar2;
    }
  }
  if (best_diff._4_4_ == 0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_vad.c"
            ,0x6f,"No suitable sampling rate found for %d\n",(ulong)frame_length_local._4_4_);
    vad_local._4_4_ = -1;
  }
  else {
    uVar1 = (ulong)((double)(int)best_diff._4_4_ * (double)frame_size);
    uVar1 = uVar1 | (long)((double)(int)best_diff._4_4_ * (double)frame_size - 9.223372036854776e+18
                          ) & (long)uVar1 >> 0x3f;
    if (best_diff._4_4_ != frame_length_local._4_4_) {
      auVar3._8_4_ = (int)(uVar1 >> 0x20);
      auVar3._0_8_ = uVar1;
      auVar3._12_4_ = 0x45300000;
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_vad.c"
              ,0x75,"Closest supported sampling rate to %d is %d, frame size %d (%.3fs)\n",
              ((auVar3._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
              (double)(int)frame_length_local._4_4_,(ulong)frame_length_local._4_4_,
              (ulong)best_diff._4_4_,uVar1);
    }
    vad_local._4_4_ = WebRtcVad_ValidRateAndFrameLength(best_diff._4_4_,uVar1);
    if (vad_local._4_4_ < 0) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_vad.c"
              ,0x78,"Unsupported frame length %f\n",frame_size);
    }
    else {
      vad->sample_rate = frame_length_local._4_4_;
      vad->closest_sample_rate = best_diff._4_4_;
      vad->frame_size = (int)uVar1;
    }
  }
  return vad_local._4_4_;
}

Assistant:

int
ps_vad_set_input_params(ps_vad_t *vad, int sample_rate, double frame_length)
{
    size_t frame_size;
    int i, rv;
    int closest_sample_rate = 0;
    double best_diff = 0.5;

    if (sample_rate == 0)
        sample_rate = PS_VAD_DEFAULT_SAMPLE_RATE;
    if (frame_length == 0)
        frame_length = PS_VAD_DEFAULT_FRAME_LENGTH;
    for (i = 0; i < n_sample_rates; ++i) {
        double diff = fabs(1.0 - (double)sample_rates[i] / sample_rate);
        if (diff < best_diff) {
            closest_sample_rate = sample_rates[i];
            best_diff = diff;
        }
    }
    if (closest_sample_rate == 0) {
        E_ERROR("No suitable sampling rate found for %d\n", sample_rate);
        return -1;
    }
    frame_size = (size_t)(closest_sample_rate * frame_length);
    if (closest_sample_rate != sample_rate) {
        E_INFO("Closest supported sampling rate to %d is %d, frame size %d (%.3fs)\n",
               sample_rate, closest_sample_rate, frame_size, (double)frame_size / sample_rate);
    }
    if ((rv = WebRtcVad_ValidRateAndFrameLength(closest_sample_rate, frame_size)) < 0) {
        E_WARN("Unsupported frame length %f\n", frame_length);
        return rv;
    }
    vad->sample_rate = sample_rate;
    vad->closest_sample_rate = closest_sample_rate;
    vad->frame_size = frame_size;
    return rv;
}